

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxStringCast::Emit(FxStringCast *this,VMFunctionBuilder *build)

{
  PType *pPVar1;
  uint uVar2;
  uint uVar3;
  uint extraout_var;
  ExpEmit EVar4;
  int opc;
  
  uVar2 = (*this->basex->_vptr_FxExpression[9])();
  if ((extraout_var & 1) != 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x4a3,"virtual ExpEmit FxStringCast::Emit(VMFunctionBuilder *)");
  }
  if ((CONCAT44(extraout_var,uVar2) & 0x10000fc0000) == 0) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(CONCAT44(extraout_var,uVar2) >> 0x10) & 3),uVar2 & 0xffff,
               uVar2 >> 0x18);
  }
  uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
  pPVar1 = this->basex->ValueType;
  if (pPVar1 == (PType *)TypeName) {
    opc = 0xb;
  }
  else {
    if (pPVar1 != (PType *)TypeSound) goto LAB_00523f00;
    opc = 0xf;
  }
  VMFunctionBuilder::Emit(build,0x3e,uVar3 & 0xffff,uVar2 & 0xffff,opc);
LAB_00523f00:
  EVar4._0_4_ = uVar3 & 0xffff | 0x1020000;
  EVar4.Konst = false;
  EVar4.Fixed = false;
  EVar4.Final = false;
  EVar4.Target = false;
  return EVar4;
}

Assistant:

ExpEmit FxStringCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);

	from.Free(build);
	ExpEmit to(build, REGT_STRING);
	if (basex->ValueType == TypeName)
	{
		build->Emit(OP_CAST, to.RegNum, from.RegNum, CAST_N2S);
	}
	else if (basex->ValueType == TypeSound)
	{
		build->Emit(OP_CAST, to.RegNum, from.RegNum, CAST_So2S);
	}
	return to;
}